

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

PAL_ERROR PROCGetProcessStatus
                    (CPalThread *pThread,HANDLE hProcess,PROCESS_STATE *pps,DWORD *pdwExitCode)

{
  PAL_ERROR PVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  _func_int **pp_Var5;
  undefined8 uVar6;
  DWORD DVar7;
  uint __pid;
  DWORD *pDVar8;
  PROCESS_STATE *pPVar9;
  IPalObject *pobjProcess;
  IDataLock *pDataLock;
  CProcProcessLocalData *pLocalData;
  CPalThread *pCStack_48;
  int status;
  DWORD *local_40;
  PROCESS_STATE *local_38;
  
  PVar1 = (**(code **)(*CorUnix::g_pObjectManager + 0x28))
                    (CorUnix::g_pObjectManager,pThread,hProcess,&aotProcess,0);
  if (PVar1 != 0) {
    return PVar1;
  }
  PVar1 = (**(code **)(_DAT_00000000 + 0x18))(0,pThread,1,&pobjProcess,&pDataLock);
  if (*(int *)((long)&pDataLock->_vptr_IDataLock + 4) == 3) {
    if (PAL_InitializeChakraCoreCalled != false) {
      *pps = PS_DONE;
      *pdwExitCode = *(DWORD *)&pDataLock[1]._vptr_IDataLock;
      pp_Var5 = pobjProcess->_vptr_IPalObject;
      uVar6 = 0;
LAB_003425ff:
      (**pp_Var5)(pobjProcess,pThread,uVar6);
      return PVar1;
    }
  }
  else {
    pCStack_48 = pThread;
    local_40 = pdwExitCode;
    local_38 = pps;
    if (PAL_InitializeChakraCoreCalled != false) {
      __pid = *(uint *)&pDataLock->_vptr_IDataLock;
      DVar7 = 1;
      local_40 = pdwExitCode;
      do {
        uVar2 = waitpid(__pid,(int *)((long)&pLocalData + 4),1);
        pDVar8 = local_40;
        __pid = *(uint *)&pDataLock->_vptr_IDataLock;
        if (uVar2 == __pid) {
          if ((pLocalData._4_4_ & 0x7f) == 0) {
            DVar7 = pLocalData._4_4_ >> 8 & 0xff;
            *local_40 = DVar7;
            pPVar9 = local_38;
            if (PAL_InitializeChakraCoreCalled == false) break;
          }
          else {
joined_r0x0034252c:
            pPVar9 = local_38;
            local_40 = pDVar8;
            if (PAL_InitializeChakraCoreCalled == false) break;
LAB_003425ca:
            *pDVar8 = DVar7;
          }
          *pPVar9 = PS_DONE;
          *(undefined4 *)((long)&pDataLock->_vptr_IDataLock + 4) = 3;
          *(DWORD *)&pDataLock[1]._vptr_IDataLock = DVar7;
LAB_003425de:
          if (PAL_InitializeChakraCoreCalled != false) {
            pp_Var5 = pobjProcess->_vptr_IPalObject;
            uVar6 = 1;
            pThread = pCStack_48;
            goto LAB_003425ff;
          }
          break;
        }
        if (uVar2 != 0xffffffff) {
          if (uVar2 != 0) {
            fprintf(_stderr,"] %s %s:%d","PROCGetProcessStatus",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                    ,0x8ef);
            fprintf(_stderr,"waitpid returned unexpected value %d\n",(ulong)uVar2);
            pPVar9 = local_38;
            goto LAB_003425ca;
          }
          if (PAL_InitializeChakraCoreCalled != false) {
            *local_38 = PS_RUNNING;
            *local_40 = 0;
            goto LAB_003425de;
          }
          break;
        }
        piVar4 = __errno_location();
        iVar3 = *piVar4;
        if (iVar3 != 4) {
          if (iVar3 == 10) {
            if (PAL_InitializeChakraCoreCalled == false) break;
            iVar3 = kill(__pid,0);
            pPVar9 = local_38;
            pDVar8 = local_40;
            if (iVar3 != 0) {
              if (*piVar4 == 3) {
                DVar7 = 0;
                goto joined_r0x0034252c;
              }
              if (PAL_InitializeChakraCoreCalled != false) {
                strerror(*piVar4);
                goto LAB_003425ca;
              }
              break;
            }
          }
          else {
            if (PAL_InitializeChakraCoreCalled == false) break;
            strerror(iVar3);
          }
          *local_38 = PS_RUNNING;
          *local_40 = 0;
          goto LAB_003425de;
        }
      } while (PAL_InitializeChakraCoreCalled != false);
    }
  }
  abort();
}

Assistant:

PAL_ERROR
PROCGetProcessStatus(
    CPalThread *pThread,
    HANDLE hProcess,
    PROCESS_STATE *pps,
    DWORD *pdwExitCode
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjProcess = NULL;
    IDataLock *pDataLock;
    CProcProcessLocalData *pLocalData;
    pid_t wait_retval;
    int status;

    //
    // First, check if we already know the status of this process. This will be
    // the case if this function has already been called for the same process.
    //

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hProcess,
        &aotProcess,
        0,
        &pobjProcess
        );

    if (NO_ERROR != palError)
    {
        goto PROCGetProcessStatusExit;
    }

    palError = pobjProcess->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void **>(&pLocalData)
        );

    if (PS_DONE == pLocalData->ps)
    {
        TRACE("We already called waitpid() on process ID %#x; process has "
              "terminated, exit code is %d\n",
              pLocalData->dwProcessId, pLocalData->dwExitCode);

        *pps = pLocalData->ps;
        *pdwExitCode = pLocalData->dwExitCode;

        pDataLock->ReleaseLock(pThread, FALSE);

        goto PROCGetProcessStatusExit;
    }

    /* By using waitpid(), we can even retrieve the exit code of a non-PAL
       process. However, note that waitpid() can only provide the low 8 bits
       of the exit code. This is all that is required for the PAL spec. */
    TRACE("Looking for status of process; trying wait()");

    while(1)
    {
        /* try to get state of process, using non-blocking call */
        wait_retval = waitpid(pLocalData->dwProcessId, &status, WNOHANG);

        if ( wait_retval == (pid_t) pLocalData->dwProcessId )
        {
            /* success; get the exit code */
            if ( WIFEXITED( status ) )
            {
                *pdwExitCode = WEXITSTATUS(status);
                TRACE("Exit code was %d\n", *pdwExitCode);
            }
            else
            {
                WARN("process terminated without exiting; can't get exit "
                     "code. faking it.\n");
                *pdwExitCode = EXIT_FAILURE;
            }
            *pps = PS_DONE;
        }
        else if (0 == wait_retval)
        {
            // The process is still running.
            TRACE("Process %#x is still active.\n", pLocalData->dwProcessId);
            *pps = PS_RUNNING;
            *pdwExitCode = 0;
        }
        else if (-1 == wait_retval)
        {
            // This might happen if waitpid() had already been called, but
            // this shouldn't happen - we call waitpid once, store the
            // result, and use that afterwards.
            // One legitimate cause of failure is EINTR; if this happens we
            // have to try again. A second legitimate cause is ECHILD, which
            // happens if we're trying to retrieve the status of a currently-
            // running process that isn't a child of this process.
            if (EINTR == errno)
            {
                TRACE("waitpid() failed with EINTR; re-waiting");
                continue;
            }
            else if (ECHILD == errno)
            {
                TRACE("waitpid() failed with ECHILD; calling kill instead");
                if (kill(pLocalData->dwProcessId, 0) != 0)
                {
                    if(ESRCH == errno)
                    {
                        WARN("kill() failed with ESRCH, i.e. target "
                             "process exited and it wasn't a child, "
                             "so can't get the exit code, assuming  "
                             "it was 0.\n");
                        *pdwExitCode = 0;
                    }
                    else
                    {
                        ERROR("kill(pid, 0) failed; errno is %d (%s)\n",
                              errno, strerror(errno));
                        *pdwExitCode = EXIT_FAILURE;
                    }
                    *pps = PS_DONE;
                }
                else
                {
                    *pps = PS_RUNNING;
                    *pdwExitCode = 0;
                }
            }
            else
            {
                // Ignoring unexpected waitpid errno and assuming that
                // the process is still running
                ERROR("waitpid(pid=%u) failed with unexpected errno=%d (%s)\n",
                      pLocalData->dwProcessId, errno, strerror(errno));
                *pps = PS_RUNNING;
                *pdwExitCode = 0;
            }
        }
        else
        {
            ASSERT("waitpid returned unexpected value %d\n",wait_retval);
            *pdwExitCode = EXIT_FAILURE;
            *pps = PS_DONE;
        }
        // Break out of the loop in all cases except EINTR.
        break;
    }

    // Save the exit code for future reference (waitpid will only work once).
    if(PS_DONE == *pps)
    {
        pLocalData->ps = PS_DONE;
        pLocalData->dwExitCode = *pdwExitCode;
    }

    TRACE( "State of process 0x%08x : %d (exit code %d)\n",
           pLocalData->dwProcessId, *pps, *pdwExitCode );

    pDataLock->ReleaseLock(pThread, TRUE);

PROCGetProcessStatusExit:

    if (NULL != pobjProcess)
    {
        pobjProcess->ReleaseReference(pThread);
    }

    return palError;
}